

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  long in_RSI;
  Promise<void> PVar2;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>_> local_48;
  PromiseFulfillerPair<void> local_38;
  
  if (*(char *)(in_RSI + 0x50) != '\x01') {
    *(undefined1 *)(in_RSI + 0x50) = 1;
    (**(code **)**(undefined8 **)(in_RSI + 0x70))(*(undefined8 **)(in_RSI + 0x70),&local_38);
    if (*(int *)(in_RSI + 0x78) == 0) {
      Promise<void>::Promise((Promise<void> *)this);
      pPVar1 = extraout_RDX_00;
    }
    else {
      newPromiseAndFulfiller<void>();
      local_48.disposer = local_38.fulfiller.disposer;
      local_48.ptr = local_38.fulfiller.ptr;
      local_38.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
      Own<kj::PromiseFulfiller<void>_>::operator=
                ((Own<kj::PromiseFulfiller<void>_> *)(in_RSI + 0x80),&local_48);
      Own<kj::PromiseFulfiller<void>_>::dispose(&local_48);
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)local_38.promise.super_PromiseBase.node.disposer;
      this->timer = (Timer *)local_38.promise.super_PromiseBase.node.ptr;
      local_38.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_38);
      pPVar1 = extraout_RDX;
    }
    PVar2.super_PromiseBase.node.ptr = pPVar1;
    PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar2.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            ((Fault *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x13b6,FAILED,"!draining","\"you can only call drain() once\"",
             (char (*) [31])"you can only call drain() once");
  _::Debug::Fault::fatal((Fault *)&local_38);
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}